

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5ExprNode * fts5ParsePhraseToAnd(Fts5Parse *pParse,Fts5ExprNearset *pNear)

{
  int *pRc;
  uint uVar1;
  Fts5ExprPhrase *pFVar2;
  undefined8 uVar3;
  int iVar4;
  Fts5ExprNode *pNode;
  Fts5ExprPhrase *pPhrase;
  char *pcVar5;
  Fts5ExprNearset *pNear_00;
  Fts5ExprNode *pFVar6;
  long lVar7;
  Fts5ExprNode **ppFVar8;
  
  uVar1 = pNear->apPhrase[0]->nTerm;
  pRc = &pParse->rc;
  pNode = (Fts5ExprNode *)sqlite3Fts5MallocZero(pRc,(long)(int)(uVar1 * 8 + 0x38));
  if (pNode != (Fts5ExprNode *)0x0) {
    pNode->eType = 2;
    pNode->nChild = uVar1;
    pNode->iHeight = 1;
    fts5ExprAssignXNext(pNode);
    pParse->nPhrase = pParse->nPhrase + -1;
    if (0 < (int)uVar1) {
      ppFVar8 = pNode->apChild;
      lVar7 = 0;
      do {
        pPhrase = (Fts5ExprPhrase *)sqlite3Fts5MallocZero(pRc,0x48);
        if (pPhrase != (Fts5ExprPhrase *)0x0) {
          iVar4 = parseGrowPhraseArray(pParse);
          if (iVar4 == 0) {
            pFVar2 = pNear->apPhrase[0];
            iVar4 = pParse->nPhrase;
            pParse->nPhrase = iVar4 + 1;
            pParse->apPhrase[iVar4] = pPhrase;
            pPhrase->nTerm = 1;
            pcVar5 = sqlite3Fts5Strndup(pRc,*(char **)((long)&pFVar2->aTerm[0].pTerm + lVar7),
                                        *(int *)((long)&pFVar2->aTerm[0].nFullTerm + lVar7));
            pPhrase->aTerm[0].pTerm = pcVar5;
            uVar3 = *(undefined8 *)((long)&pFVar2->aTerm[0].nQueryTerm + lVar7);
            pPhrase->aTerm[0].nQueryTerm = (int)uVar3;
            pPhrase->aTerm[0].nFullTerm = (int)((ulong)uVar3 >> 0x20);
            pNear_00 = sqlite3Fts5ParseNearset(pParse,(Fts5ExprNearset *)0x0,pPhrase);
            pFVar6 = sqlite3Fts5ParseNode(pParse,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,pNear_00)
            ;
            *ppFVar8 = pFVar6;
          }
          else {
            fts5ExprPhraseFree(pPhrase);
          }
        }
        ppFVar8 = ppFVar8 + 1;
        lVar7 = lVar7 + 0x28;
      } while ((ulong)uVar1 * 0x28 != lVar7);
    }
    if (*pRc == 0) {
      sqlite3Fts5ParseNearsetFree(pNear);
      return pNode;
    }
    sqlite3Fts5ParseNodeFree(pNode);
  }
  return (Fts5ExprNode *)0x0;
}

Assistant:

static Fts5ExprNode *fts5ParsePhraseToAnd(
  Fts5Parse *pParse,
  Fts5ExprNearset *pNear
){
  int nTerm = pNear->apPhrase[0]->nTerm;
  int ii;
  int nByte;
  Fts5ExprNode *pRet;

  assert( pNear->nPhrase==1 );
  assert( pParse->bPhraseToAnd );

  nByte = sizeof(Fts5ExprNode) + nTerm*sizeof(Fts5ExprNode*);
  pRet = (Fts5ExprNode*)sqlite3Fts5MallocZero(&pParse->rc, nByte);
  if( pRet ){
    pRet->eType = FTS5_AND;
    pRet->nChild = nTerm;
    pRet->iHeight = 1;
    fts5ExprAssignXNext(pRet);
    pParse->nPhrase--;
    for(ii=0; ii<nTerm; ii++){
      Fts5ExprPhrase *pPhrase = (Fts5ExprPhrase*)sqlite3Fts5MallocZero(
          &pParse->rc, sizeof(Fts5ExprPhrase)
      );
      if( pPhrase ){
        if( parseGrowPhraseArray(pParse) ){
          fts5ExprPhraseFree(pPhrase);
        }else{
          Fts5ExprTerm *p = &pNear->apPhrase[0]->aTerm[ii];
          Fts5ExprTerm *pTo = &pPhrase->aTerm[0];
          pParse->apPhrase[pParse->nPhrase++] = pPhrase;
          pPhrase->nTerm = 1;
          pTo->pTerm = sqlite3Fts5Strndup(&pParse->rc, p->pTerm, p->nFullTerm);
          pTo->nQueryTerm = p->nQueryTerm;
          pTo->nFullTerm = p->nFullTerm;
          pRet->apChild[ii] = sqlite3Fts5ParseNode(pParse, FTS5_STRING,
              0, 0, sqlite3Fts5ParseNearset(pParse, 0, pPhrase)
          );
        }
      }
    }

    if( pParse->rc ){
      sqlite3Fts5ParseNodeFree(pRet);
      pRet = 0;
    }else{
      sqlite3Fts5ParseNearsetFree(pNear);
    }
  }

  return pRet;
}